

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing-utils.c
# Opt level: O2

_Bool str_to_int32(char *string,int32_t *out)

{
  char cVar1;
  size_t sVar2;
  int *piVar3;
  long lVar4;
  int32_t iVar5;
  long lVar6;
  int __base;
  ulong uVar7;
  _Bool _Var8;
  char *endptr;
  
  sVar2 = strlen(string);
  __base = 10;
  if (sVar2 == 0) {
    lVar6 = 1;
    uVar7 = 0;
  }
  else {
    cVar1 = *string;
    if ((cVar1 == '-') || (cVar1 == '+')) {
      sVar2 = sVar2 - 1;
      string = string + 1;
      lVar6 = (ulong)(cVar1 != '-') * 2 + -1;
    }
    else {
      lVar6 = 1;
    }
    uVar7 = sVar2;
    if ((1 < sVar2) && (uVar7 = 1, *string == '0')) {
      if (string[1] == 'b') {
        __base = 2;
      }
      else {
        if (string[1] != 'x') goto LAB_00106654;
        __base = 0x10;
      }
      uVar7 = sVar2 - 2;
      string = string + 2;
    }
  }
LAB_00106654:
  endptr = (char *)0x0;
  piVar3 = __errno_location();
  *piVar3 = 0;
  lVar4 = strtol(string,&endptr,__base);
  iVar5 = -0x80000000;
  _Var8 = false;
  if (((uVar7 != 0) && (_Var8 = false, *piVar3 != 0x22)) &&
     (0xfffffffeffffffff < lVar4 * lVar6 - 0x80000000U)) {
    if (endptr == (char *)0x0 || endptr == string) {
      _Var8 = false;
    }
    else {
      _Var8 = *endptr == '\0';
      iVar5 = -0x80000000;
      if (_Var8) {
        iVar5 = (int32_t)(lVar4 * lVar6);
      }
    }
  }
  *out = iVar5;
  return _Var8;
}

Assistant:

bool str_to_int32(const char *string, int32_t *out) {
    size_t len = strlen(string);
    int base = 10;

    bool is_negated = false;
    if (len >= 1 && (string[0] == '-' || string[0] == '+')) {
        is_negated = string[0] == '-';

        len -= 1;
        string += 1;
    }

    if (len >= 2 && string[0] == '0' && string[1] == 'x') {
        base = 16;
        string += 2;
        len -= 2;
    } else if (len >= 2 && string[0] == '0' && string[1] == 'b') {
        base = 2;
        string += 2;
        len -= 2;
    }

    STATIC_ASSERT(sizeof(long) >= sizeof(int32_t),
                  "These sizes should match so that we can use the correct "
                  "strtoXXX C function");

    char *endptr = NULL;
    errno = 0;
    long conv_ret_val = strtol(string, &endptr, base);
    conv_ret_val *= is_negated ? -1 : +1;

    bool out_of_range = (errno == ERANGE) || (conv_ret_val < INT32_MIN) ||
                        (conv_ret_val > INT32_MAX);

    bool failed =
        len == 0 || out_of_range || endptr == string || endptr == NULL;
    bool result = !failed && *endptr == '\0';

    if (result) {
        *out = conv_ret_val;
    } else {
        *out = INT32_MIN;
    }

    return result;
}